

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void SerializeMany<VectorWriter,int,Wrapper<CustomUintFormatter<8,false>,ServiceFlags&>,long,long,ParamsWrapper<CNetAddr::SerParams,CService>,long,ParamsWrapper<CNetAddr::SerParams,CService>,unsigned_long,std::__cxx11::string,int,bool>
               (VectorWriter *s,int *args,
               Wrapper<CustomUintFormatter<8,_false>,_ServiceFlags_&> *args_1,long *args_2,
               long *args_3,ParamsWrapper<CNetAddr::SerParams,_CService> *args_4,long *args_5,
               ParamsWrapper<CNetAddr::SerParams,_CService> *args_6,unsigned_long *args_7,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_8,int *args_9
               ,bool *args_10)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ser_writedata32<VectorWriter>(s,*args);
  Wrapper<CustomUintFormatter<8,_false>,_ServiceFlags_&>::Serialize<VectorWriter>(args_1,s);
  ser_writedata64<VectorWriter>(s,*args_2);
  ser_writedata64<VectorWriter>(s,*args_3);
  ParamsWrapper<CNetAddr::SerParams,_CService>::Serialize<VectorWriter>(args_4,s);
  ser_writedata64<VectorWriter>(s,*args_5);
  ParamsWrapper<CNetAddr::SerParams,_CService>::Serialize<VectorWriter>(args_6,s);
  ser_writedata64<VectorWriter>(s,*args_7);
  Serialize<VectorWriter,char>(s,args_8);
  ser_writedata32<VectorWriter>(s,*args_9);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    Serialize<VectorWriter>(s,*args_10);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}